

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_pool.c
# Opt level: O1

upb_FieldDef * upb_DefPool_FindExtensionByNameWithSize(upb_DefPool *s,char *name,size_t size)

{
  bool bVar1;
  _Bool _Var2;
  upb_deftype_t uVar3;
  int iVar4;
  int iVar5;
  upb_FieldDef *puVar6;
  upb_MessageDef *m;
  upb_MessageDef *puVar7;
  upb_FieldDef *unaff_RBX;
  upb_value v;
  upb_value local_30;
  
  _Var2 = upb_strtable_lookup2(&s->syms,name,size,&local_30);
  if (_Var2) {
    uVar3 = _upb_DefType_Type(local_30);
    if (uVar3 == UPB_DEFTYPE_MSG) {
      m = (upb_MessageDef *)_upb_DefType_Unpack(local_30,UPB_DEFTYPE_MSG);
      _Var2 = _upb_MessageDef_InMessageSet(m);
      if (_Var2) {
        iVar4 = upb_MessageDef_NestedExtensionCount(m);
        bVar1 = 0 < iVar4;
        if (0 < iVar4) {
          puVar6 = upb_MessageDef_NestedExtension(m,0);
          puVar7 = upb_FieldDef_MessageSubDef(puVar6);
          unaff_RBX = puVar6;
          if (puVar7 != m) {
            iVar4 = 1;
            do {
              iVar5 = upb_MessageDef_NestedExtensionCount(m);
              bVar1 = iVar4 < iVar5;
              unaff_RBX = puVar6;
              if (iVar5 <= iVar4) break;
              unaff_RBX = upb_MessageDef_NestedExtension(m,iVar4);
              puVar7 = upb_FieldDef_MessageSubDef(unaff_RBX);
              iVar4 = iVar4 + 1;
            } while (puVar7 != m);
          }
        }
        if (bVar1) {
          return unaff_RBX;
        }
      }
    }
    else if (uVar3 == UPB_DEFTYPE_EXT) {
      puVar6 = (upb_FieldDef *)_upb_DefType_Unpack(local_30,UPB_DEFTYPE_EXT);
      return puVar6;
    }
  }
  return (upb_FieldDef *)0x0;
}

Assistant:

const upb_FieldDef* upb_DefPool_FindExtensionByNameWithSize(
    const upb_DefPool* s, const char* name, size_t size) {
  upb_value v;
  if (!upb_strtable_lookup2(&s->syms, name, size, &v)) return NULL;

  switch (_upb_DefType_Type(v)) {
    case UPB_DEFTYPE_FIELD:
      return _upb_DefType_Unpack(v, UPB_DEFTYPE_FIELD);
    case UPB_DEFTYPE_MSG: {
      const upb_MessageDef* m = _upb_DefType_Unpack(v, UPB_DEFTYPE_MSG);
      if (_upb_MessageDef_InMessageSet(m)) {
        for (int i = 0; i < upb_MessageDef_NestedExtensionCount(m); i++) {
          const upb_FieldDef* ext = upb_MessageDef_NestedExtension(m, i);
          if (upb_FieldDef_MessageSubDef(ext) == m) {
            return ext;
          }
        }
      }
      return NULL;
    }
    default:
      break;
  }

  return NULL;
}